

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

int mp_read_int64(char **data,int64_t *ret)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong *puVar4;
  ulong uVar5;
  
  pcVar3 = *data;
  cVar1 = *pcVar3;
  puVar4 = (ulong *)(pcVar3 + 1);
  switch(cVar1) {
  case -0x34:
    uVar5 = (ulong)(byte)pcVar3[1];
    goto LAB_00105dc2;
  case -0x33:
    puVar4 = (ulong *)(pcVar3 + 3);
    uVar5 = (ulong)(ushort)(*(ushort *)(pcVar3 + 1) << 8 | *(ushort *)(pcVar3 + 1) >> 8);
    break;
  case -0x32:
    uVar2 = *(uint *)(pcVar3 + 1);
    uVar5 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
    puVar4 = (ulong *)(pcVar3 + 5);
    break;
  case -0x31:
    uVar5 = *puVar4;
    uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    if ((long)uVar5 < 0) {
      return -1;
    }
    goto LAB_00105de7;
  case -0x30:
    uVar5 = (ulong)pcVar3[1];
LAB_00105dc2:
    puVar4 = (ulong *)(pcVar3 + 2);
    break;
  case -0x2f:
    puVar4 = (ulong *)(pcVar3 + 3);
    uVar5 = (ulong)(short)(*(ushort *)(pcVar3 + 1) << 8 | *(ushort *)(pcVar3 + 1) >> 8);
    break;
  case -0x2e:
    uVar2 = *(uint *)(pcVar3 + 1);
    puVar4 = (ulong *)(pcVar3 + 5);
    uVar5 = (ulong)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
    break;
  case -0x2d:
    uVar5 = *(ulong *)(pcVar3 + 1);
    uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
LAB_00105de7:
    puVar4 = (ulong *)(pcVar3 + 9);
    break;
  default:
    if (cVar1 < -0x20) {
      return -1;
    }
    uVar5 = (ulong)cVar1;
  }
  *ret = uVar5;
  *data = (char *)puVar4;
  return 0;
}

Assistant:

MP_IMPL int
mp_read_int64(const char **data, int64_t *ret)
{
	uint64_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t)mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t)mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t)mp_load_u32(&p);
		break;
	case 0xd3:
		*ret = (int64_t)mp_load_u64(&p);
		break;
	case 0xcc:
		*ret = (int64_t)mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = (int64_t)mp_load_u16(&p);
		break;
	case 0xce:
		*ret = (int64_t)mp_load_u32(&p);
		break;
	case 0xcf:
		uval = mp_load_u64(&p);
		if (mp_unlikely(uval > INT64_MAX))
			return -1;
		*ret = (int64_t)uval;
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}